

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::RelationsAnalyzer::inferShiftInLoop
          (RelationsAnalyzer *this,
          vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
          Handle placeholder)

{
  bool bVar1;
  Shift SVar2;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RCX;
  RelationsAnalyzer *in_RDX;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RSI;
  ValueRelations *in_RDI;
  VectorSet<const_llvm::Value_*> *in_R8;
  Value **in_stack_00000008;
  Type in_stack_00000014;
  Bucket *in_stack_00000018;
  ValueRelations *in_stack_00000020;
  Type rel;
  Shift shift;
  VectorSet<const_llvm::Value_*> *initial;
  HandlePtr from;
  ValueRelations *predGraph;
  Handle in_stack_000000b0;
  Shift in_stack_000000bc;
  VectorSet<const_llvm::Value_*> *in_stack_000000c0;
  VRLocation *in_stack_000000c8;
  RelationsAnalyzer *in_stack_000000d0;
  Bucket *in_stack_ffffffffffffff88;
  uint i;
  VRLocation *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Type TVar3;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::operator[]
            (in_RSI,0);
  getCorrespondingByContent
            ((ValueRelations *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffffb0._M_current);
  ValueRelations::getPointedTo<dg::vr::Bucket>
            ((ValueRelations *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  i = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  ValueRelations::getEqual
            (in_RDI,(Handle)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bVar1 = VectorSet<const_llvm::Value_*>::empty((VectorSet<const_llvm::Value_*> *)0x1d1a3a);
  if ((!bVar1) && (SVar2 = getShift(in_RDX,in_RCX,in_R8), SVar2 != UNKNOWN)) {
    if ((SVar2 == INC) || (SVar2 == DEC)) {
      std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::
      operator[](in_RSI,0);
      VRLocation::getSuccLocation(in_stack_ffffffffffffff90,i);
      inferFromNonEquality
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                 in_stack_000000b0);
    }
    if (SVar2 == EQ) {
      TVar3 = EQ;
    }
    else {
      TVar3 = SGE;
      if (SVar2 == INC) {
        TVar3 = SLE;
      }
    }
    dg::vr::Relations::inverted(TVar3);
    VectorSet<const_llvm::Value_*>::begin((VectorSet<const_llvm::Value_*> *)in_RCX);
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator*((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                 *)&stack0xffffffffffffffb0);
    ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
              (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008);
  }
  return;
}

Assistant:

void RelationsAnalyzer::inferShiftInLoop(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    const ValueRelations &predGraph = changeLocations[0]->relations;
    HandlePtr from = getCorrespondingByContent(predGraph, froms);
    assert(from);

    const auto &initial = predGraph.getEqual(predGraph.getPointedTo(*from));
    if (initial.empty())
        return;

    auto shift = getShift(changeLocations, froms);
    if (shift == Shift::UNKNOWN)
        return;

    if (shift == Shift::INC || shift == Shift::DEC)
        inferFromNonEquality(*changeLocations[0]->getSuccLocation(0), froms,
                             shift, placeholder);

    Relations::Type rel =
            shift == Shift::EQ
                    ? Relations::EQ
                    : (shift == Shift::INC ? Relations::SLE : Relations::SGE);

    // placeholder must be first so that if setting EQ, its bucket is
    // preserved
    newGraph.set(placeholder, Relations::inverted(rel), *initial.begin());
}